

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptInitializer(HlslGrammar *this,TIntermTyped **node)

{
  byte *pbVar1;
  TIntermTyped *left;
  bool bVar2;
  bool bVar3;
  int iVar4;
  TIntermAggregate *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *syntax;
  TIntermTyped *expr;
  TSourceLoc loc;
  TIntermTyped *local_50;
  TSourceLoc local_48;
  
  bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
  if (bVar2) {
    local_48.column = (this->super_HlslTokenStream).token.loc.column;
    local_48._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
    local_48.name = (this->super_HlslTokenStream).token.loc.name;
    local_48.string = (this->super_HlslTokenStream).token.loc.string;
    local_48.line = (this->super_HlslTokenStream).token.loc.line;
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
    if (bVar2) {
      pTVar5 = TIntermediate::makeAggregate(this->intermediate,&local_48);
      *node = (TIntermTyped *)pTVar5;
    }
    else {
      *node = (TIntermTyped *)0x0;
      syntax = "assignment expression in initializer list";
      do {
        bVar2 = acceptAssignmentExpression(this,&local_50);
        if (!bVar2) {
LAB_003347e6:
          expected(this,syntax);
          goto LAB_003347f1;
        }
        left = *node;
        pTVar5 = TIntermediate::growAggregate
                           (this->intermediate,&left->super_TIntermNode,&local_50->super_TIntermNode
                            ,&local_48);
        *node = (TIntermTyped *)pTVar5;
        if ((left == (TIntermTyped *)0x0) &&
           (iVar4 = (*(local_50->super_TIntermNode)._vptr_TIntermNode[0x21])(),
           (*(uint *)(CONCAT44(extraout_var,iVar4) + 8) & 0x7f) == 2)) {
          iVar4 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[0x21])();
          *(ulong *)(CONCAT44(extraout_var_00,iVar4) + 8) =
               *(ulong *)(CONCAT44(extraout_var_00,iVar4) + 8) & 0xffffffffffffff80 | 2;
        }
        else {
          iVar4 = (*(local_50->super_TIntermNode)._vptr_TIntermNode[0x21])();
          if ((*(uint *)(CONCAT44(extraout_var_01,iVar4) + 8) & 0x7f) != 2) {
            iVar4 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[0x21])();
            pbVar1 = (byte *)(CONCAT44(extraout_var_02,iVar4) + 8);
            *pbVar1 = *pbVar1 & 0x80;
          }
        }
        bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
        bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
        if (!bVar2) {
          if (bVar3) {
            return true;
          }
          syntax = ", or }";
          goto LAB_003347e6;
        }
      } while (!bVar3);
    }
    bVar2 = true;
  }
  else {
LAB_003347f1:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool HlslGrammar::acceptInitializer(TIntermTyped*& node)
{
    // LEFT_BRACE
    if (! acceptTokenClass(EHTokLeftBrace))
        return false;

    // RIGHT_BRACE
    TSourceLoc loc = token.loc;
    if (acceptTokenClass(EHTokRightBrace)) {
        // a zero-length initializer list
        node = intermediate.makeAggregate(loc);
        return true;
    }

    // initializer_list
    node = nullptr;
    do {
        // assignment_expression
        TIntermTyped* expr;
        if (! acceptAssignmentExpression(expr)) {
            expected("assignment expression in initializer list");
            return false;
        }

        const bool firstNode = (node == nullptr);

        node = intermediate.growAggregate(node, expr, loc);

        // If every sub-node in the list has qualifier EvqConst, the returned node becomes
        // EvqConst.  Otherwise, it becomes EvqTemporary. That doesn't happen with e.g.
        // EvqIn or EvqPosition, since the collection isn't EvqPosition if all the members are.
        if (firstNode && expr->getQualifier().storage == EvqConst)
            node->getQualifier().storage = EvqConst;
        else if (expr->getQualifier().storage != EvqConst)
            node->getQualifier().storage = EvqTemporary;

        // COMMA
        if (acceptTokenClass(EHTokComma)) {
            if (acceptTokenClass(EHTokRightBrace))  // allow trailing comma
                return true;
            continue;
        }

        // RIGHT_BRACE
        if (acceptTokenClass(EHTokRightBrace))
            return true;

        expected(", or }");
        return false;
    } while (true);
}